

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

double __thiscall sector_t::FindLowestFloorSurrounding(sector_t *this,vertex_t **v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ushort uVar10;
  line_t *plVar11;
  vertex_t *pvVar12;
  vertex_t *pvVar13;
  ulong uVar14;
  sector_t *psVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar10 = this->linecount;
  if ((ulong)uVar10 != 0) {
    pvVar13 = (*this->lines)->v1;
    dVar1 = (this->floorplane).D;
    dVar2 = (this->floorplane).normal.X;
    dVar3 = (this->floorplane).normal.Y;
    dVar4 = (this->floorplane).negiC;
    dVar16 = ((pvVar13->p).Y * dVar3 + (pvVar13->p).X * dVar2 + dVar1) * dVar4;
    if (0 < (short)uVar10) {
      uVar14 = 0;
      do {
        plVar11 = this->lines[uVar14];
        if ((plVar11->flags & 4) == 0) {
          psVar15 = (sector_t *)0x0;
        }
        else {
          psVar15 = plVar11->frontsector;
          if (plVar11->frontsector == this) {
            psVar15 = (sector_t *)0x0;
            if (plVar11->backsector != this) {
              psVar15 = plVar11->backsector;
            }
          }
        }
        if (psVar15 != (sector_t *)0x0) {
          pvVar12 = plVar11->v1;
          dVar5 = (psVar15->floorplane).D;
          dVar6 = (psVar15->floorplane).normal.X;
          dVar7 = (psVar15->floorplane).normal.Y;
          dVar8 = (pvVar12->p).X;
          dVar9 = (pvVar12->p).Y;
          dVar17 = (psVar15->floorplane).negiC;
          dVar18 = (dVar7 * dVar9 + dVar6 * dVar8 + dVar5) * dVar17;
          if ((dVar18 < dVar16) && (dVar18 < (dVar9 * dVar3 + dVar8 * dVar2 + dVar1) * dVar4)) {
            pvVar13 = pvVar12;
            dVar16 = dVar18;
          }
          pvVar12 = plVar11->v2;
          dVar8 = (pvVar12->p).X;
          dVar9 = (pvVar12->p).Y;
          dVar17 = dVar17 * (dVar7 * dVar9 + dVar5 + dVar6 * dVar8);
          if ((dVar17 < dVar16) && (dVar17 < (dVar9 * dVar3 + dVar8 * dVar2 + dVar1) * dVar4)) {
            pvVar13 = pvVar12;
            dVar16 = dVar17;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
    if (v != (vertex_t **)0x0) {
      *v = pvVar13;
    }
    return dVar16;
  }
  return this->planes[0].TexZ;
}

Assistant:

double sector_t::FindLowestFloorSurrounding (vertex_t **v) const
{
	int i;
	sector_t *other;
	line_t *check;
	double floor;
	double ofloor;
	vertex_t *spot;

	if (linecount == 0) return GetPlaneTexZ(sector_t::floor);

	spot = lines[0]->v1;
	floor = floorplane.ZatPoint(spot);

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			ofloor = other->floorplane.ZatPoint (check->v1);
			if (ofloor < floor && ofloor < floorplane.ZatPoint (check->v1))
			{
				floor = ofloor;
				spot = check->v1;
			}
			ofloor = other->floorplane.ZatPoint (check->v2);
			if (ofloor < floor && ofloor < floorplane.ZatPoint (check->v2))
			{
				floor = ofloor;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return floor;
}